

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O0

int __thiscall
CNetBan::Unban<CNetBan::CBanPool<CNetRange,16>>
          (CNetBan *this,CBanPool<CNetRange,_16> *pBanPool,CDataType *pData)

{
  long lVar1;
  CBan<CNetRange> *pBan_00;
  IConsole *pIVar2;
  CNetRange *in_RDX;
  CBanPool<CNetRange,_16> *in_RSI;
  CNetBan *in_RDI;
  long in_FS_OFFSET;
  CBan<CNetRange> *pBan;
  CNetHash NetHash;
  char aBuf [256];
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  CBanPool<CNetRange,_16> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  int iVar3;
  int in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  char *in_stack_fffffffffffffef8;
  CBan<CNetRange> *in_stack_ffffffffffffff00;
  CNetBan *in_stack_ffffffffffffff08;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CNetHash::CNetHash((CNetHash *)&stack0xfffffffffffffef0,in_RDX);
  pBan_00 = CBanPool<CNetRange,_16>::Find
                      (in_stack_fffffffffffffec8,(CDataType *)in_RDI,
                       (CNetHash *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (pBan_00 == (CBan<CNetRange> *)0x0) {
    pIVar2 = Console(in_RDI);
    (*(pIVar2->super_IInterface)._vptr_IInterface[0x19])
              (pIVar2,0,"net_ban","unban failed (invalid entry)");
    iVar3 = -1;
  }
  else {
    MakeBanInfo<CNetRange>
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,
               (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    CBanPool<CNetRange,_16>::Remove(in_RSI,pBan_00);
    pIVar2 = Console(in_RDI);
    (*(pIVar2->super_IInterface)._vptr_IInterface[0x19])
              (pIVar2,0,"net_ban",&stack0xfffffffffffffef8);
    iVar3 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int CNetBan::Unban(T *pBanPool, const typename T::CDataType *pData)
{
	CNetHash NetHash(pData);
	CBan<typename T::CDataType> *pBan = pBanPool->Find(pData, &NetHash);
	if(pBan)
	{
		char aBuf[256];
		MakeBanInfo(pBan, aBuf, sizeof(aBuf), MSGTYPE_BANREM);
		pBanPool->Remove(pBan);
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aBuf);
		return 0;
	}
	else
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", "unban failed (invalid entry)");
	return -1;
}